

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::D3MFExporter::writeMesh(D3MFExporter *this,aiMesh *mesh)

{
  ostringstream *poVar1;
  ostream *poVar2;
  long lVar3;
  uint i;
  ulong uVar4;
  
  if (mesh != (aiMesh *)0x0) {
    poVar1 = &this->mModelOutput;
    poVar2 = std::operator<<((ostream *)poVar1,"<");
    poVar2 = std::operator<<(poVar2,(string *)XmlTag::mesh_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,">");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)poVar1,"<");
    poVar2 = std::operator<<(poVar2,(string *)XmlTag::vertices_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,">");
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < mesh->mNumVertices; uVar4 = uVar4 + 1) {
      writeVertex(this,(aiVector3D *)((long)&mesh->mVertices->x + lVar3));
      lVar3 = lVar3 + 0xc;
    }
    poVar2 = std::operator<<((ostream *)poVar1,"</");
    poVar2 = std::operator<<(poVar2,(string *)XmlTag::vertices_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,">");
    std::endl<char,std::char_traits<char>>(poVar2);
    writeFaces(this,mesh,mesh->mMaterialIndex);
    poVar2 = std::operator<<((ostream *)poVar1,"</");
    poVar2 = std::operator<<(poVar2,(string *)XmlTag::mesh_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,">");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  return;
}

Assistant:

void D3MFExporter::writeMesh( aiMesh *mesh ) {
    if ( nullptr == mesh ) {
        return;
    }

    mModelOutput << "<" << XmlTag::mesh << ">" << std::endl;
    mModelOutput << "<" << XmlTag::vertices << ">" << std::endl;
    for ( unsigned int i = 0; i < mesh->mNumVertices; ++i ) {
        writeVertex( mesh->mVertices[ i ] );
    }
    mModelOutput << "</" << XmlTag::vertices << ">" << std::endl;

    const unsigned int matIdx( mesh->mMaterialIndex );

    writeFaces( mesh, matIdx );

    mModelOutput << "</" << XmlTag::mesh << ">" << std::endl;
}